

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_GetFontOffsetForIndex(uchar *data,int index)

{
  int iVar1;
  int index_local;
  uchar *data_local;
  
  iVar1 = stbtt_GetFontOffsetForIndex_internal(data,index);
  return iVar1;
}

Assistant:

STBTT_DEF int stbtt_GetFontOffsetForIndex(const unsigned char *data, int index)
{
   return stbtt_GetFontOffsetForIndex_internal((unsigned char *) data, index);
}